

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O3

void cfd::TransactionContextUtil::AddScriptHashSign<cfd::ConfidentialTransactionContext>
               (ConfidentialTransactionContext *transaction,OutPoint *outpoint,
               vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *signatures,
               Script *redeem_script,AddressType address_type,bool is_multisig_script)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pSVar2;
  value_type *pvVar3;
  bool bVar4;
  bool bVar5;
  OutPoint *outpoint_00;
  char cVar6;
  SignDataType SVar7;
  CfdException *pCVar8;
  SignParameter *signature;
  pointer pSVar9;
  value_type *__x;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> scriptsig;
  Script locking_script;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> local_138;
  ConfidentialTransactionContext *local_118;
  AddressType local_10c;
  ByteData local_108;
  SignParameter local_e8;
  OutPoint *local_70;
  Script local_68;
  
  local_118 = transaction;
  local_10c = address_type;
  cVar6 = cfd::core::Script::IsEmpty();
  if (cVar6 != '\0') {
    local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfd_transaction_internal.cpp";
    local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0xa7;
    local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "AddScriptHashSign";
    core::logger::log<>((CfdSourceLocation *)&local_e8,kCfdLogLevelWarning,
                        "Failed to AddScriptHashSign. Empty script.");
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&local_e8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Empty script.","");
    core::CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&local_e8);
    __cxa_throw(pCVar8,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_70 = outpoint;
  cVar6 = cfd::core::OutPoint::IsValid();
  if (cVar6 != '\0') {
    pSVar9 = (signatures->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pSVar2 = (signatures->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    while( true ) {
      if (pSVar9 == pSVar2) {
        cfd::core::Script::Script(&local_68);
        local_138.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_138.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_138.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (address_type == kP2shAddress) {
          bVar5 = true;
          if (is_multisig_script) {
            SignParameter::SignParameter(&local_e8,(ScriptOperator *)&core::ScriptOperator::OP_0);
            std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
            emplace_back<cfd::SignParameter>(&local_138,&local_e8);
            local_e8.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_002b0f30;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8.op_code_.text_data_._M_dataplus._M_p !=
                &local_e8.op_code_.text_data_.field_2) {
              operator_delete(local_e8.op_code_.text_data_._M_dataplus._M_p);
            }
            if (local_e8.related_pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_e8.related_pubkey_.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_e8.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_e8.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
          }
          bVar4 = false;
        }
        else {
          if (address_type == kP2wshAddress) {
            bVar5 = false;
          }
          else {
            if (address_type != kP2shP2wshAddress) {
              local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start = "cfd_transaction_internal.cpp";
              local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0xcf;
              local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = "AddScriptHashSign";
              core::logger::log<cfd::core::AddressType&>
                        ((CfdSourceLocation *)&local_e8,kCfdLogLevelWarning,
                         "Failed to AddScriptHashSign. Invalid address_type: {}",&local_10c);
              pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
              local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((long)&local_e8.data_.data_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data + 0x10);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_e8,
                         "Invalid address_type. address_type must be \"p2wsh\" or \"p2sh-p2wsh\" or \"p2sh\"."
                         ,"");
              core::CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&local_e8);
              __cxa_throw(pCVar8,&core::CfdException::typeinfo,core::CfdException::~CfdException);
            }
            cfd::core::ScriptUtil::CreateP2wshLockingScript((Script *)&local_e8);
            cfd::core::Script::operator=(&local_68,(Script *)&local_e8);
            core::Script::~Script((Script *)&local_e8);
            bVar5 = true;
          }
          bVar4 = true;
          if (is_multisig_script) {
            cfd::core::ByteData::ByteData(&local_108);
            SignParameter::SignParameter(&local_e8,&local_108);
            std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
            emplace_back<cfd::SignParameter>(&local_138,&local_e8);
            local_e8.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_002b0f30;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8.op_code_.text_data_._M_dataplus._M_p !=
                &local_e8.op_code_.text_data_.field_2) {
              operator_delete(local_e8.op_code_.text_data_._M_dataplus._M_p);
            }
            if (local_e8.related_pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_e8.related_pubkey_.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_e8.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_e8.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_108.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
          }
        }
        pvVar3 = (signatures->
                 super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        pSVar9 = local_138.
                 super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl
                 .super__Vector_impl_data._M_start;
        pSVar2 = local_138.
                 super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        for (__x = (signatures->
                   super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
                   _M_impl.super__Vector_impl_data._M_start;
            local_138.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
            _M_impl.super__Vector_impl_data._M_start = pSVar9,
            local_138.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
            _M_impl.super__Vector_impl_data._M_finish = pSVar2, __x != pvVar3; __x = __x + 1) {
          std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                    (&local_138,__x);
          pSVar9 = local_138.
                   super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pSVar2 = local_138.
                   super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        SignParameter::SignParameter(&local_e8,redeem_script);
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
        emplace_back<cfd::SignParameter>(&local_138,&local_e8);
        paVar1 = &local_e8.op_code_.text_data_.field_2;
        local_e8.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_002b0f30;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.op_code_.text_data_._M_dataplus._M_p != paVar1) {
          operator_delete(local_e8.op_code_.text_data_._M_dataplus._M_p);
        }
        if (local_e8.related_pubkey_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.related_pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        outpoint_00 = local_70;
        if (bVar4) {
          AddSign<cfd::ConfidentialTransactionContext>
                    (local_118,local_70,&local_138,true,pSVar9 != pSVar2);
        }
        if (bVar5) {
          cVar6 = cfd::core::Script::IsEmpty();
          if (cVar6 == '\0') {
            local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            SignParameter::SignParameter(&local_e8,&local_68);
            std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
            emplace_back<cfd::SignParameter>
                      ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)&local_108
                       ,&local_e8);
            local_e8.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_002b0f30;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8.op_code_.text_data_._M_dataplus._M_p != paVar1) {
              operator_delete(local_e8.op_code_.text_data_._M_dataplus._M_p);
            }
            if (local_e8.related_pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_e8.related_pubkey_.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_e8.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_e8.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            AddSign<cfd::ConfidentialTransactionContext>
                      (local_118,outpoint_00,
                       (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)&local_108
                       ,false,true);
            std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
                      ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)&local_108
                      );
          }
          else {
            AddSign<cfd::ConfidentialTransactionContext>
                      (local_118,outpoint_00,&local_138,false,pSVar9 != pSVar2);
          }
        }
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&local_138);
        core::Script::~Script(&local_68);
        return;
      }
      SVar7 = SignParameter::GetDataType(pSVar9);
      if ((SVar7 != kSign) && (SVar7 = SignParameter::GetDataType(pSVar9), SVar7 != kBinary)) break;
      pSVar9 = pSVar9 + 1;
    }
    local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfd_transaction_internal.cpp";
    local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0xb3;
    local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "AddScriptHashSign";
    local_68._vptr_Script._0_4_ = SignParameter::GetDataType(pSVar9);
    core::logger::log<cfd::SignDataType&>
              ((CfdSourceLocation *)&local_e8,kCfdLogLevelWarning,
               "Failed to AddScriptHashSign. Invalid signature type: {}",(SignDataType *)&local_68);
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&local_e8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,
               "Invalid signature type. signature type must be \"kSign\" or \"kBinary\".","");
    core::CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&local_e8);
    __cxa_throw(pCVar8,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfd_transaction_internal.cpp";
  local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0xab;
  local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "AddScriptHashSign";
  core::logger::log<>((CfdSourceLocation *)&local_e8,kCfdLogLevelWarning,
                      "Failed to AddScriptHashSign. Invalid outpoint.");
  pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
  local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_e8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Invalid outpoint.","");
  core::CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&local_e8);
  __cxa_throw(pCVar8,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void TransactionContextUtil::AddScriptHashSign(
    Tx* transaction, const OutPoint& outpoint,
    const std::vector<SignParameter>& signatures, const Script& redeem_script,
    AddressType address_type, bool is_multisig_script) {
  if (redeem_script.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "Failed to AddScriptHashSign. Empty script.");
    throw CfdException(CfdError::kCfdIllegalArgumentError, "Empty script.");
  }
  if (!outpoint.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to AddScriptHashSign. Invalid outpoint.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid outpoint.");
  }
  for (const auto& signature : signatures) {
    if ((signature.GetDataType() != SignDataType::kSign) &&
        (signature.GetDataType() != SignDataType::kBinary)) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to AddScriptHashSign. Invalid signature type: {}",
          signature.GetDataType());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid signature type. signature type must be \"kSign\" "
          "or \"kBinary\".");  // NOLINT
    }
  }

  bool has_witness = false;
  bool has_scriptsig = false;
  Script locking_script;
  std::vector<SignParameter> sign_params;
  switch (address_type) {
    case AddressType::kP2wshAddress:
      has_witness = true;
      break;
    case AddressType::kP2shP2wshAddress:
      has_witness = true;
      has_scriptsig = true;
      locking_script = ScriptUtil::CreateP2wshLockingScript(redeem_script);
      break;
    case AddressType::kP2shAddress:
      has_scriptsig = true;
      break;
    default:
      warn(
          CFD_LOG_SOURCE,
          "Failed to AddScriptHashSign. Invalid address_type: {}",
          address_type);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid address_type. address_type must be \"p2wsh\" "
          "or \"p2sh-p2wsh\" or \"p2sh\".");  // NOLINT
  }
  if (is_multisig_script) {
    if (has_witness) {
      sign_params.push_back(SignParameter(ByteData()));
    } else {
      sign_params.push_back(SignParameter(ScriptOperator::OP_0));
    }
  }
  for (const auto& signature : signatures) {
    sign_params.push_back(signature);
  }
  bool clear_stack = (sign_params.empty()) ? false : true;
  sign_params.push_back(SignParameter(redeem_script));

  if (has_witness) {
    AddSign(transaction, outpoint, sign_params, true, clear_stack);
  }
  if (has_scriptsig) {
    if (!locking_script.IsEmpty()) {  // p2sh-p2wpkh
      std::vector<SignParameter> scriptsig;
      scriptsig.push_back(SignParameter(locking_script));
      AddSign(transaction, outpoint, scriptsig, false, true);
    } else {
      AddSign(transaction, outpoint, sign_params, false, clear_stack);
    }
  }
}